

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::TrainManager::release_train(TrainManager *this,int argc,string *argv)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  void *pvVar4;
  pair<unsigned_int,_bool> pVar5;
  long lVar6;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  pair<long,_bool> pVar7;
  pair<unsigned_long_long,_unsigned_int> pVar8;
  undefined1 auVar9 [16];
  uint in_stack_00000024;
  uint in_stack_00000028;
  uint in_stack_0000002c;
  TrainManager *in_stack_00000030;
  pair<sjtu::TrainManager::stationNameType_*,_long> ret_;
  pair<unsigned_int,_bool> ret_1;
  int train_id;
  int i_1;
  trainType *train;
  pair<long,_bool> ret;
  int i;
  string trainID;
  value_type *in_stack_00000350;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
  *in_stack_00000358;
  uint *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  invalid_command *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffffe18;
  unsigned_long_long *in_stack_fffffffffffffe58;
  allocator *paVar10;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffffe60;
  undefined8 local_148;
  string *local_140;
  uint local_138;
  uint local_130;
  allocator local_129;
  string local_128 [32];
  hashType local_108;
  pair<unsigned_long_long,_unsigned_int> local_100;
  pair<const_unsigned_long_long,_unsigned_int> local_f0;
  allocator local_d9;
  string local_d8 [32];
  hashType local_b8;
  uint local_b0;
  byte local_ac;
  int local_a8;
  int local_a4;
  long local_a0;
  long local_98;
  undefined1 local_90;
  string local_88 [32];
  hashType local_68;
  long local_60;
  byte local_58;
  int local_3c;
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_38);
  local_3c = 0;
  while( true ) {
    if (local_c <= local_3c) {
      std::__cxx11::string::string(local_88,local_38);
      local_68 = StringHasher::operator()
                           ((StringHasher *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe08);
      pVar7 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                        (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_98 = pVar7.first;
      local_90 = pVar7.second;
      local_60 = local_98;
      local_58 = local_90;
      std::__cxx11::string::~string(local_88);
      if ((local_58 & 1) == 0) {
        pvVar4 = (void *)std::ostream::operator<<(&std::cout,-1);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_a0 = (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],&local_60);
        if ((*(byte *)(local_a0 + 0xa799) & 1) == 1) {
          pvVar4 = (void *)std::ostream::operator<<(&std::cout,-1);
          std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        }
        else {
          local_a4 = 0;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(local_a0 + 0xa7a0);
          local_a8 = SUB164(auVar9 / ZEXT816(0xa7a8),0) + -1;
          for (; local_a4 < *(int *)(local_a0 + 0x18); local_a4 = local_a4 + 1) {
            lVar6 = (long)local_a4;
            lVar1 = local_a0 + 0x20;
            paVar10 = &local_d9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_d8,(char *)(lVar1 + lVar6 * 0x1a8),paVar10);
            local_b8 = StringHasher::operator()
                                 ((StringHasher *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  in_stack_fffffffffffffe08);
            pVar5 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                    ::find(in_stack_fffffffffffffe18,
                           (unsigned_long_long *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
            local_b0 = pVar5.first;
            local_ac = pVar5.second;
            std::__cxx11::string::~string(local_d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_d9);
            if ((local_ac & 1) == 0) {
              in_stack_fffffffffffffe18 =
                   (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                    *)*in_RDI;
              lVar6 = (long)local_a4;
              lVar1 = local_a0 + 0x20;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_128,(char *)(lVar1 + lVar6 * 0x1a8),&local_129);
              local_108 = StringHasher::operator()
                                    ((StringHasher *)
                                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                     in_stack_fffffffffffffe08);
              in_stack_fffffffffffffe14 = bitset_newblock(in_stack_00000030,in_stack_0000002c);
              local_130 = in_stack_fffffffffffffe14;
              pVar8 = std::make_pair<unsigned_long_long,unsigned_int>
                                ((unsigned_long_long *)in_stack_fffffffffffffde0,
                                 in_stack_fffffffffffffdd8);
              in_stack_fffffffffffffe08 = (string *)pVar8.first;
              local_138 = pVar8.second;
              local_140 = in_stack_fffffffffffffe08;
              local_100.first = (unsigned_long_long)in_stack_fffffffffffffe08;
              local_100.second = local_138;
              std::pair<const_unsigned_long_long,_unsigned_int>::
              pair<unsigned_long_long,_unsigned_int,_true>(&local_f0,&local_100);
              BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
              insert(in_stack_00000358,in_stack_00000350);
              std::__cxx11::string::~string(local_128);
              std::allocator<char>::~allocator((allocator<char> *)&local_129);
              auVar9 = (**(code **)(*(long *)in_RDI[3] + 8))();
              local_148 = auVar9._8_8_;
              strcpy(auVar9._0_8_,(char *)(local_a0 + 0x20 + (long)local_a4 * 0x1a8));
              (**(code **)(*(long *)in_RDI[3] + 0x18))((long *)in_RDI[3],&local_148);
            }
            else {
              bitset_set(in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000024);
            }
          }
          *(undefined1 *)(local_a0 + 0xa799) = 1;
          (**(code **)(*(long *)in_RDI[4] + 0x18))();
          pvVar4 = (void *)std::ostream::operator<<(&std::cout,0);
          std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      std::__cxx11::string::~string(local_38);
      return;
    }
    bVar2 = std::operator==(in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
    if (!bVar2) break;
    std::__cxx11::string::operator=(local_38,(string *)((long)local_3c * 0x20 + 0x20 + local_18));
    local_3c = local_3c + 2;
  }
  uVar3 = __cxa_allocate_exception(0x68);
  invalid_command::invalid_command(in_stack_fffffffffffffdf0);
  __cxa_throw(uVar3,&invalid_command::typeinfo,invalid_command::~invalid_command);
}

Assistant:

void release_train(int argc , std::string *argv)
		{
			std::string trainID;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else
			{
				trainType *train = TrainFile -> read(ret.first);
				if (train -> is_released == true) std::cout << -1 << std::endl;
				else
				{
					for (int i = 0 , train_id = train -> offset / sizeof (DynamicFileManager<trainType>::valueType) - 1;i < train -> stationNum;++ i)
					{
						auto ret = StationBpTree -> find(hasher(train -> stations[i].stationName));
						if (ret.second) bitset_set(ret.first , train_id);
						else
						{
							StationBpTree -> insert(std::make_pair(hasher(train -> stations[i].stationName) , bitset_newblock(train_id)));
							auto ret_ = StationFile -> newspace();
							strcpy(ret_.first -> name , train -> stations[i].stationName);
							StationFile -> save(ret_.second);
						}
					}
					train -> is_released = true , TrainFile -> save(train -> offset);
					std::cout << 0 << std::endl;
				}
			}
		}